

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  char local_829;
  long lStack_828;
  char letter;
  size_t n_1;
  size_t n;
  char word_b [1024];
  char word_a [1024];
  char **argv_local;
  int argc_local;
  
  printf("Tell me two words and I will tell you their letters in common!\n");
  do {
    printf("> ");
    pcVar3 = fgets(word_b + 0x3f8,0x400,_stdin);
    if (pcVar3 == (char *)0x0) {
      return 1;
    }
  } while (word_b[0x3f8] == '\n');
  do {
    printf("> ");
    pcVar3 = fgets((char *)&n,0x400,_stdin);
    if (pcVar3 == (char *)0x0) {
      return 1;
    }
  } while ((char)n == '\n');
  for (n_1 = 0; word_b[n_1 + 0x3f8] != '\0'; n_1 = n_1 + 1) {
    iVar2 = toupper((int)word_b[n_1 + 0x3f8]);
    word_b[n_1 + 0x3f8] = (char)iVar2;
  }
  for (lStack_828 = 0; word_b[lStack_828 + -8] != '\0'; lStack_828 = lStack_828 + 1) {
    iVar2 = toupper((int)word_b[lStack_828 + -8]);
    word_b[lStack_828 + -8] = (char)iVar2;
  }
  printf("These two words have in common the following letters: ");
  for (local_829 = 'A'; local_829 < '['; local_829 = local_829 + '\x01') {
    _Var1 = is_present(local_829,word_b + 0x3f8);
    if ((_Var1) && (_Var1 = is_present(local_829,(char *)&n), _Var1)) {
      printf("%c ",(ulong)(uint)(int)local_829);
    }
  }
  printf("\n");
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char word_a[1024];
  char word_b[1024];
  printf("Tell me two words and I will tell you their letters in common!\n");

  do {
    printf("> ");
    if (fgets(word_a, sizeof word_a, stdin) == NULL) return 1;
  } while (word_a[0] == '\n');
  do {
    printf("> ");
    if (fgets(word_b, sizeof word_b, stdin) == NULL) return 1;
  } while (word_b[0] == '\n');

  // Compact toupper, cf. 13.1
  for (size_t n = 0; word_a[n]; n++) word_a[n] = (char)toupper(word_a[n]);
  for (size_t n = 0; word_b[n]; n++) word_b[n] = (char)toupper(word_b[n]);

  printf("These two words have in common the following letters: ");
  for (char letter = 'A'; letter <= 'Z'; letter++) {
    if (is_present(letter, word_a) && is_present(letter, word_b)) {
      printf("%c ", letter);
    }
  }
  printf("\n");
  return 0;
}